

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O0

void injection::InjectionManager::bind_singleton<ITest>(ITest *singleton)

{
  anon_class_8_1_bc83feab local_38;
  function<ITest_*()> local_30;
  ITest *local_10;
  ITest *singleton_local;
  
  local_38.singleton = &local_10;
  local_10 = singleton;
  std::function<ITest*()>::
  function<injection::InjectionManager::bind_singleton<ITest>(ITest*)::_lambda()_1_,void>
            ((function<ITest*()> *)&local_30,&local_38);
  bind<ITest>(&local_30,SINGLETON_EAGER);
  std::function<ITest_*()>::~function(&local_30);
  return;
}

Assistant:

static void bind_singleton(I* singleton) {
        InjectionManager::bind<I>([&singleton](){return singleton;}, InjectionScope::SINGLETON_EAGER);
    }